

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall QString::fill(QString *this,QChar ch,qsizetype size)

{
  long lVar1;
  char16_t *pcVar2;
  long lVar3;
  char16_t __tmp;
  
  if (size < 0) {
    size = (this->d).size;
  }
  resize(this,size);
  lVar1 = (this->d).size;
  if (lVar1 != 0) {
    pcVar2 = (this->d).ptr;
    for (lVar3 = 0; lVar1 * 2 != lVar3; lVar3 = lVar3 + 2) {
      *(char16_t *)((long)pcVar2 + lVar3) = ch.ucs;
    }
  }
  return this;
}

Assistant:

QString& QString::fill(QChar ch, qsizetype size)
{
    resize(size < 0 ? d.size : size);
    if (d.size)
        std::fill(d.data(), d.data() + d.size, ch.unicode());
    return *this;
}